

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_initCStream_usingCDict_advanced
                 (ZSTD_CStream *zcs,ZSTD_CDict *cdict,ZSTD_frameParameters fParams,
                 unsigned_long_long pledgedSrcSize)

{
  uint uVar1;
  int in_ECX;
  undefined8 in_RDX;
  ZSTD_CCtx *in_RDI;
  unsigned_long_long in_R8;
  size_t err_code_2;
  size_t err_code_1;
  size_t err_code;
  ZSTD_CCtx *in_stack_ffffffffffffffa8;
  size_t local_8;
  
  local_8 = ZSTD_CCtx_reset(in_stack_ffffffffffffffa8,0);
  uVar1 = ERR_isError(local_8);
  if (uVar1 == 0) {
    local_8 = ZSTD_CCtx_setPledgedSrcSize(in_RDI,in_R8);
    uVar1 = ERR_isError(local_8);
    if (uVar1 == 0) {
      (in_RDI->requestedParams).fParams.contentSizeFlag = (int)in_RDX;
      (in_RDI->requestedParams).fParams.checksumFlag = (int)((ulong)in_RDX >> 0x20);
      (in_RDI->requestedParams).fParams.noDictIDFlag = in_ECX;
      local_8 = ZSTD_CCtx_refCDict(in_stack_ffffffffffffffa8,(ZSTD_CDict *)0x23dc39);
      uVar1 = ERR_isError(local_8);
      if (uVar1 == 0) {
        local_8 = 0;
      }
    }
  }
  return local_8;
}

Assistant:

size_t ZSTD_initCStream_usingCDict_advanced(ZSTD_CStream* zcs,
                                            const ZSTD_CDict* cdict,
                                            ZSTD_frameParameters fParams,
                                            unsigned long long pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_initCStream_usingCDict_advanced");
    FORWARD_IF_ERROR( ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only) , "");
    FORWARD_IF_ERROR( ZSTD_CCtx_setPledgedSrcSize(zcs, pledgedSrcSize) , "");
    zcs->requestedParams.fParams = fParams;
    FORWARD_IF_ERROR( ZSTD_CCtx_refCDict(zcs, cdict) , "");
    return 0;
}